

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vpgen_clip_polygon.cpp
# Opt level: O3

void __thiscall agg::vpgen_clip_polygon::line_to(vpgen_clip_polygon *this,double x,double y)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  vpgen_clip_polygon *pvVar5;
  vpgen_clip_polygon *pvVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  
  *(undefined8 *)(this + 0x78) = 0;
  uVar3 = clipping_flags(this,x,y);
  if (*(uint *)(this + 0x30) == uVar3) {
    if (uVar3 != 0) goto LAB_0011c75b;
    *(double *)(this + 0x38) = x;
    *(double *)(this + 0x58) = y;
    uVar4 = 1;
  }
  else {
    auVar18 = *(undefined1 (*) [16])this;
    dVar1 = *(double *)(this + 0x20);
    dVar2 = *(double *)(this + 0x28);
    auVar15._0_8_ = x - dVar1;
    auVar15._8_8_ = y - dVar2;
    auVar20._8_8_ = -(ulong)(auVar18._8_8_ < dVar2);
    auVar20._0_8_ = -(ulong)(auVar18._0_8_ < dVar1);
    auVar20 = blendvpd(_DAT_0011dc40,_DAT_0012c6c0,auVar20);
    auVar16._8_8_ = -(ulong)(auVar15._8_8_ == 0.0);
    auVar16._0_8_ = -(ulong)(auVar15._0_8_ == 0.0);
    auVar16 = blendvpd(auVar15,auVar20,auVar16);
    dVar14 = auVar16._0_8_;
    dVar17 = auVar16._8_8_;
    auVar7._8_8_ = -(ulong)(0.0 < dVar17);
    auVar7._0_8_ = -(ulong)(0.0 < dVar14);
    auVar20 = blendvpd(auVar18,*(undefined1 (*) [16])(this + 0x10),auVar7);
    auVar18 = blendvpd(*(undefined1 (*) [16])(this + 0x10),auVar18,auVar7);
    dVar13 = auVar18._0_8_;
    dVar9 = auVar18._8_8_;
    auVar18._0_8_ = dVar13 - dVar1;
    auVar18._8_8_ = dVar9 - dVar2;
    auVar18 = divpd(auVar18,auVar16);
    dVar8 = auVar18._0_8_;
    dVar10 = auVar18._8_8_;
    dVar23 = dVar8;
    if (dVar10 <= dVar8) {
      dVar23 = dVar10;
    }
    uVar4 = 0;
    if (dVar23 <= 1.0) {
      dVar24 = dVar10;
      if (dVar10 <= dVar8) {
        dVar24 = dVar8;
      }
      if (dVar23 <= 0.0) {
        pvVar6 = this + 0x38;
        pvVar5 = this + 0x58;
      }
      else {
        pvVar6 = this + 0x40;
        *(double *)(this + 0x38) = dVar13;
        pvVar5 = this + 0x60;
        *(double *)(this + 0x58) = dVar9;
      }
      uVar4 = (uint)(dVar23 > 0.0);
      if (dVar24 <= 1.0) {
        dVar11 = auVar20._0_8_;
        dVar12 = auVar20._8_8_;
        auVar21._0_8_ = dVar11 - dVar1;
        auVar21._8_8_ = dVar12 - dVar2;
        auVar18 = divpd(auVar21,auVar16);
        dVar22 = auVar18._8_8_;
        dVar19 = auVar18._0_8_;
        dVar23 = dVar19;
        if (dVar22 <= dVar19) {
          dVar23 = dVar22;
        }
        if ((0.0 < dVar24) || (0.0 < dVar23)) {
          if (dVar24 <= dVar23) {
            if (0.0 < dVar24) {
              if (dVar10 < dVar8) {
                dVar9 = dVar8 * dVar17 + dVar2;
              }
              *(ulong *)pvVar6 =
                   -(ulong)(dVar10 < dVar8) & (ulong)dVar13 |
                   ~-(ulong)(dVar10 < dVar8) & (ulong)(dVar10 * dVar14 + dVar1);
              pvVar6 = pvVar6 + 8;
              *(double *)pvVar5 = dVar9;
              pvVar5 = pvVar5 + 8;
              uVar4 = uVar4 + 1;
            }
            if (1.0 <= dVar23) {
              *(double *)pvVar6 = x;
              dVar12 = y;
            }
            else if (dVar22 <= dVar19) {
              *(double *)pvVar6 = dVar22 * dVar14 + dVar1;
            }
            else {
              *(double *)pvVar6 = dVar11;
              dVar12 = dVar19 * dVar17 + dVar2;
            }
            *(double *)pvVar5 = dVar12;
          }
          else {
            if (dVar8 <= dVar10) {
              dVar13 = dVar11;
            }
            *(double *)pvVar6 = dVar13;
            *(ulong *)pvVar5 =
                 ~-(ulong)(dVar10 < dVar8) & (ulong)dVar9 | (ulong)dVar12 & -(ulong)(dVar10 < dVar8)
            ;
          }
          uVar4 = uVar4 + 1;
        }
      }
    }
  }
  *(uint *)(this + 0x78) = uVar4;
LAB_0011c75b:
  *(uint *)(this + 0x30) = uVar3;
  *(double *)(this + 0x20) = x;
  *(double *)(this + 0x28) = y;
  return;
}

Assistant:

void vpgen_clip_polygon::line_to(double x, double y)
    {
        m_vertex = 0;
        m_num_vertices = 0;
        unsigned flags = clipping_flags(x, y);

        if(m_clip_flags == flags)
        {
            if(flags == 0)
            {
                m_x[0] = x;
                m_y[0] = y;
                m_num_vertices = 1;
            }
        }
        else
        {
            m_num_vertices = clip_liang_barsky(m_x1, m_y1, 
                                               x, y, 
                                               m_clip_box, 
                                               m_x, m_y);
        }

        m_clip_flags = flags;
        m_x1 = x;
        m_y1 = y;
    }